

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O0

void SetMaterialTextureProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *param_2,TextureInfo prop,
               aiMaterial *mat,aiTextureType texType,uint texSlot)

{
  bool bVar1;
  uint uVar2;
  Texture *pTVar3;
  Image *pIVar4;
  uint *puVar5;
  Sampler *pSVar6;
  aiTextureMapMode local_c50;
  aiTextureMapMode local_c4c;
  aiTextureMapMode wrapT;
  aiTextureMapMode wrapS;
  aiString id;
  aiString name;
  Ref<glTF2::Sampler> sampler;
  int texIdx;
  aiString uri;
  uint texSlot_local;
  aiTextureType texType_local;
  aiMaterial *mat_local;
  Asset *param_1_local;
  vector<int,_std::allocator<int>_> *embeddedTexIdxs_local;
  
  uri.data._1016_4_ = texSlot;
  uri.data._1020_4_ = texType;
  bVar1 = glTF2::Ref::operator_cast_to_bool((Ref *)&prop);
  if (bVar1) {
    pTVar3 = glTF2::Ref<glTF2::Texture>::operator->(&prop.texture);
    bVar1 = glTF2::Ref::operator_cast_to_bool((Ref *)&pTVar3->source);
    if (bVar1) {
      pTVar3 = glTF2::Ref<glTF2::Texture>::operator->(&prop.texture);
      pIVar4 = glTF2::Ref<glTF2::Image>::operator->(&pTVar3->source);
      aiString::aiString((aiString *)&sampler.field_0xc,&pIVar4->uri);
      pTVar3 = glTF2::Ref<glTF2::Texture>::operator->(&prop.texture);
      uVar2 = glTF2::Ref<glTF2::Image>::GetIndex(&pTVar3->source);
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                 (embeddedTexIdxs,(ulong)uVar2);
      sampler.index = *puVar5;
      if (sampler.index != 0xffffffff) {
        texIdx._0_1_ = 0x2a;
        uVar2 = Assimp::ASSIMP_itoa10((char *)((long)&texIdx + 1),0x3ff,sampler.index);
        sampler._12_4_ = uVar2 + 1;
      }
      aiMaterial::AddProperty
                (mat,(aiString *)&sampler.field_0xc,"$tex.file",uri.data._1020_4_,uri.data._1016_4_)
      ;
      aiMaterial::AddProperty<unsigned_int>
                (mat,&prop.texCoord,1,"$tex.file.texCoord",uri.data._1020_4_,uri.data._1016_4_);
      pTVar3 = glTF2::Ref<glTF2::Texture>::operator->(&prop.texture);
      bVar1 = glTF2::Ref::operator_cast_to_bool((Ref *)&pTVar3->sampler);
      if (bVar1) {
        pTVar3 = glTF2::Ref<glTF2::Texture>::operator->(&prop.texture);
        name.data._1016_8_ = (pTVar3->sampler).vector;
        sampler.vector =
             *(vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> **)
              &(pTVar3->sampler).index;
        pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
        aiString::aiString((aiString *)(id.data + 0x3f8),&(pSVar6->super_Object).name);
        pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
        aiString::aiString((aiString *)&wrapT,&(pSVar6->super_Object).id);
        aiMaterial::AddProperty
                  (mat,(aiString *)(id.data + 0x3f8),"$tex.mappingname",uri.data._1020_4_,
                   uri.data._1016_4_);
        aiMaterial::AddProperty
                  (mat,(aiString *)&wrapT,"$tex.mappingid",uri.data._1020_4_,uri.data._1016_4_);
        pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
        local_c4c = ConvertWrappingMode(pSVar6->wrapS);
        pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
        local_c50 = ConvertWrappingMode(pSVar6->wrapT);
        aiMaterial::AddProperty<aiTextureMapMode>
                  (mat,&local_c4c,1,"$tex.mapmodeu",uri.data._1020_4_,uri.data._1016_4_);
        aiMaterial::AddProperty<aiTextureMapMode>
                  (mat,&local_c50,1,"$tex.mapmodev",uri.data._1020_4_,uri.data._1016_4_);
        pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
        if (pSVar6->magFilter != UNSET) {
          pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->
                             ((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
          aiMaterial::AddProperty<glTF2::SamplerMagFilter>
                    (mat,&pSVar6->magFilter,1,"$tex.mappingfiltermag",uri.data._1020_4_,
                     uri.data._1016_4_);
        }
        pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
        if (pSVar6->minFilter != UNSET) {
          pSVar6 = glTF2::Ref<glTF2::Sampler>::operator->
                             ((Ref<glTF2::Sampler> *)(name.data + 0x3f8));
          aiMaterial::AddProperty<glTF2::SamplerMinFilter>
                    (mat,&pSVar6->minFilter,1,"$tex.mappingfiltermin",uri.data._1020_4_,
                     uri.data._1016_4_);
        }
      }
    }
  }
  return;
}

Assistant:

inline void SetMaterialTextureProperty(std::vector<int>& embeddedTexIdxs, Asset& /*r*/, glTF2::TextureInfo prop, aiMaterial* mat, aiTextureType texType, unsigned int texSlot = 0)
{
    if (prop.texture && prop.texture->source) {
        aiString uri(prop.texture->source->uri);

        int texIdx = embeddedTexIdxs[prop.texture->source.GetIndex()];
        if (texIdx != -1) { // embedded
            // setup texture reference string (copied from ColladaLoader::FindFilenameForEffectTexture)
            uri.data[0] = '*';
            uri.length = 1 + ASSIMP_itoa10(uri.data + 1, MAXLEN - 1, texIdx);
        }

        mat->AddProperty(&uri, AI_MATKEY_TEXTURE(texType, texSlot));
        mat->AddProperty(&prop.texCoord, 1, _AI_MATKEY_GLTF_TEXTURE_TEXCOORD_BASE, texType, texSlot);

        if (prop.texture->sampler) {
            Ref<Sampler> sampler = prop.texture->sampler;

            aiString name(sampler->name);
            aiString id(sampler->id);

            mat->AddProperty(&name, AI_MATKEY_GLTF_MAPPINGNAME(texType, texSlot));
            mat->AddProperty(&id, AI_MATKEY_GLTF_MAPPINGID(texType, texSlot));

            aiTextureMapMode wrapS = ConvertWrappingMode(sampler->wrapS);
            aiTextureMapMode wrapT = ConvertWrappingMode(sampler->wrapT);
            mat->AddProperty(&wrapS, 1, AI_MATKEY_MAPPINGMODE_U(texType, texSlot));
            mat->AddProperty(&wrapT, 1, AI_MATKEY_MAPPINGMODE_V(texType, texSlot));

            if (sampler->magFilter != SamplerMagFilter::UNSET) {
                mat->AddProperty(&sampler->magFilter, 1, AI_MATKEY_GLTF_MAPPINGFILTER_MAG(texType, texSlot));
            }

            if (sampler->minFilter != SamplerMinFilter::UNSET) {
                mat->AddProperty(&sampler->minFilter, 1, AI_MATKEY_GLTF_MAPPINGFILTER_MIN(texType, texSlot));
            }
        }
    }
}